

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxAssign::Resolve(FxAssign *this,FCompileContext *ctx)

{
  PType *pPVar1;
  PType *pPVar2;
  PStruct *this_00;
  PClass *pPVar3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxTypeCast *this_01;
  undefined **ppuVar7;
  PClass *pPVar8;
  undefined4 extraout_var_02;
  PClass *pPVar9;
  undefined4 extraout_var_04;
  char *message;
  bool bVar10;
  bool writable;
  undefined1 local_29;
  FxExpression *pFVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_03;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->Base == (FxExpression *)0x0) goto LAB_00523b5f;
  iVar5 = (*this->Base->_vptr_FxExpression[2])();
  pFVar6 = (FxExpression *)CONCAT44(extraout_var,iVar5);
  this->Base = pFVar6;
  if (pFVar6 == (FxExpression *)0x0) goto LAB_00523b5f;
  (this->super_FxExpression).ValueType = pFVar6->ValueType;
  pFVar6 = this->Right;
  if (pFVar6 == (FxExpression *)0x0) goto LAB_00523b5f;
  iVar5 = (*pFVar6->_vptr_FxExpression[2])(pFVar6,ctx);
  pFVar6 = (FxExpression *)CONCAT44(extraout_var_00,iVar5);
  this->Right = pFVar6;
  if (pFVar6 == (FxExpression *)0x0) goto LAB_00523b5f;
  pPVar1 = this->Base->ValueType;
  if (((this->IsModifyAssign == true) && (pPVar1 == (PType *)TypeBool)) &&
     (pFVar6->ValueType != pPVar1)) {
    message = "Invalid modify/assign operation with a boolean operand";
  }
  else {
    cVar4 = (**(code **)(*(long *)&pPVar1->super_PTypeBase + 0x40))();
    if ((cVar4 == '\0') ||
       (iVar5 = (*(this->Right->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])(),
       (char)iVar5 == '\0')) {
      pPVar9 = PNativeStruct::RegistrationInfo.MyClass;
      pPVar8 = PArray::RegistrationInfo.MyClass;
      pPVar1 = this->Base->ValueType;
      pPVar2 = this->Right->ValueType;
      if (pPVar1 != pPVar2) {
        pPVar8 = (pPVar2->super_PTypeBase).super_DObject.Class;
        if (pPVar8 == (PClass *)0x0) {
          iVar5 = (**(pPVar2->super_PTypeBase).super_DObject._vptr_DObject)(pPVar2);
          pPVar8 = (PClass *)CONCAT44(extraout_var_01,iVar5);
          (pPVar2->super_PTypeBase).super_DObject.Class = pPVar8;
        }
        pPVar3 = PPointer::RegistrationInfo.MyClass;
        if (pPVar8 == pPVar9) {
          pPVar1 = this->Base->ValueType;
          pPVar8 = (pPVar1->super_PTypeBase).super_DObject.Class;
          if (pPVar8 == (PClass *)0x0) {
            iVar5 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
            pPVar8 = (PClass *)CONCAT44(extraout_var_02,iVar5);
            (pPVar1->super_PTypeBase).super_DObject.Class = pPVar8;
          }
          bVar10 = pPVar8 != (PClass *)0x0;
          if (pPVar8 != pPVar3 && bVar10) {
            do {
              pPVar8 = pPVar8->ParentClass;
              bVar10 = pPVar8 != (PClass *)0x0;
              if (pPVar8 == pPVar3) break;
            } while (pPVar8 != (PClass *)0x0);
          }
          if ((bVar10) &&
             (pFVar6 = this->Right,
             (PType *)this->Base->ValueType[1].super_PTypeBase.super_DObject._vptr_DObject ==
             pFVar6->ValueType)) {
            (*pFVar6->_vptr_FxExpression[4])(pFVar6,ctx,&local_29);
            this->Right->ValueType = this->Base->ValueType;
            goto LAB_00523b1b;
          }
        }
        this_01 = (FxTypeCast *)FMemArena::Alloc(&FxAlloc,0x38);
        FxTypeCast::FxTypeCast(this_01,this->Right,this->Base->ValueType,false,false);
LAB_005239f6:
        this->Right = &this_01->super_FxExpression;
        ppuVar7 = (this_01->super_FxExpression)._vptr_FxExpression;
        goto LAB_00523b09;
      }
      pPVar9 = (pPVar1->super_PTypeBase).super_DObject.Class;
      if (pPVar9 == (PClass *)0x0) {
        iVar5 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
        pPVar9 = (PClass *)CONCAT44(extraout_var_03,iVar5);
        (pPVar1->super_PTypeBase).super_DObject.Class = pPVar9;
      }
      bVar10 = pPVar9 != (PClass *)0x0;
      if (pPVar9 != pPVar8 && bVar10) {
        do {
          pPVar9 = pPVar9->ParentClass;
          bVar10 = pPVar9 != (PClass *)0x0;
          if (pPVar9 == pPVar8) break;
        } while (pPVar9 != (PClass *)0x0);
      }
      if (bVar10) {
        message = "Cannot assign arrays";
      }
      else {
        this_00 = (PStruct *)this->Base->ValueType;
        if (((this_00 == TypeVector2) || (this_00 == TypeVector3)) ||
           (bVar10 = DObject::IsKindOf((DObject *)this_00,PStruct::RegistrationInfo.MyClass),
           !bVar10)) goto LAB_00523b1b;
        message = "Struct assignment not implemented yet";
      }
    }
    else {
      pPVar1 = (this->super_FxExpression).ValueType;
      if (this->Right->ValueType != pPVar1) {
        if (pPVar1 == (PType *)TypeBool) {
          this_01 = (FxTypeCast *)FMemArena::Alloc(&FxAlloc,0x38);
          pFVar6 = this->Right;
          (this_01->super_FxExpression)._vptr_FxExpression =
               (_func_int **)&PTR__FxExpression_0070d370;
          FScriptPosition::FScriptPosition
                    (&(this_01->super_FxExpression).ScriptPosition,&pFVar6->ScriptPosition);
          (this_01->super_FxExpression).isresolved = false;
          (this_01->super_FxExpression).NeedResult = true;
          (this_01->super_FxExpression).ExprType = EFX_BoolCast;
          ppuVar7 = &PTR__FxBoolCast_0070b548;
          (this_01->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxBoolCast_0070b548
          ;
          this_01->basex = pFVar6;
          (this_01->super_FxExpression).ValueType = (PType *)TypeBool;
          this_01->NoWarn = true;
        }
        else {
          if (pPVar1->RegType == '\0') {
            this_01 = (FxTypeCast *)FMemArena::Alloc(&FxAlloc,0x38);
            FxIntCast::FxIntCast((FxIntCast *)this_01,this->Right,ctx->FromDecorate,false);
            goto LAB_005239f6;
          }
          this_01 = (FxTypeCast *)FMemArena::Alloc(&FxAlloc,0x30);
          pFVar6 = this->Right;
          (this_01->super_FxExpression)._vptr_FxExpression =
               (_func_int **)&PTR__FxExpression_0070d370;
          FScriptPosition::FScriptPosition
                    (&(this_01->super_FxExpression).ScriptPosition,&pFVar6->ScriptPosition);
          (this_01->super_FxExpression).isresolved = false;
          (this_01->super_FxExpression).NeedResult = true;
          (this_01->super_FxExpression).ExprType = EFX_FloatCast;
          ppuVar7 = &PTR__FxFloatCast_0070b618;
          (this_01->super_FxExpression)._vptr_FxExpression =
               (_func_int **)&PTR__FxFloatCast_0070b618;
          this_01->basex = pFVar6;
          (this_01->super_FxExpression).ValueType = (PType *)TypeFloat64;
        }
        this->Right = &this_01->super_FxExpression;
LAB_00523b09:
        iVar5 = (*((_func_int **)ppuVar7)[2])(this_01,ctx);
        this->Right = (FxExpression *)CONCAT44(extraout_var_04,iVar5);
        if ((FxExpression *)CONCAT44(extraout_var_04,iVar5) == (FxExpression *)0x0)
        goto LAB_00523b5f;
      }
LAB_00523b1b:
      iVar5 = (*this->Base->_vptr_FxExpression[4])(this->Base,ctx,&this->AddressWritable);
      if (((char)iVar5 != '\0') && (this->AddressWritable != false)) {
        iVar5 = (*this->Base->_vptr_FxExpression[8])();
        this->IsBitWrite = iVar5;
        return &this->super_FxExpression;
      }
      message = "Expression must be a modifiable value";
    }
  }
  FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,message);
LAB_00523b5f:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxAssign::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Base, ctx);

	ValueType = Base->ValueType;

	SAFE_RESOLVE(Right, ctx);

	if (IsModifyAssign && Base->ValueType == TypeBool && Right->ValueType != TypeBool)
	{
		// If the modify operation resulted in a type promotion from bool to int, this must be blocked.
		// (this means, for bool, only &=, ^= and |= are allowed, although DECORATE is more lax.)
		ScriptPosition.Message(MSG_ERROR, "Invalid modify/assign operation with a boolean operand");
		delete this;
		return nullptr;
	}

	// keep the redundant handling for numeric types here to avoid problems with DECORATE.
	// for non-numerics FxTypeCast can be used without issues.
	if (Base->IsNumeric() && Right->IsNumeric())
	{
		if (Right->ValueType != ValueType)
		{
			if (ValueType == TypeBool)
			{
				Right = new FxBoolCast(Right);
			}
			else if (ValueType->GetRegType() == REGT_INT)
			{
				Right = new FxIntCast(Right, ctx.FromDecorate);
			}
			else
			{
				Right = new FxFloatCast(Right);
			}
			SAFE_RESOLVE(Right, ctx);
		}
	}
	else if (Base->ValueType == Right->ValueType)
	{
		if (Base->ValueType->IsKindOf(RUNTIME_CLASS(PArray)))
		{
			ScriptPosition.Message(MSG_ERROR, "Cannot assign arrays");
			delete this;
			return nullptr;
		}
		if (!Base->IsVector() && Base->ValueType->IsKindOf(RUNTIME_CLASS(PStruct)))
		{
			ScriptPosition.Message(MSG_ERROR, "Struct assignment not implemented yet");
			delete this;
			return nullptr;
		}
		// Both types are the same so this is ok.
	}
	else if (Right->ValueType->IsA(RUNTIME_CLASS(PNativeStruct)) && Base->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)) && static_cast<PPointer*>(Base->ValueType)->PointedType == Right->ValueType)
	{
		// allow conversion of native structs to pointers of the same type. This is necessary to assign elements from global arrays like players, sectors, etc. to local pointers.
		// For all other types this is not needed. Structs are not assignable and classes can only exist as references.
		bool writable;
		Right->RequestAddress(ctx, &writable);
		Right->ValueType = Base->ValueType;
	}
	else
	{
		// pass it to FxTypeCast for complete handling.
		Right = new FxTypeCast(Right, Base->ValueType, false);
		SAFE_RESOLVE(Right, ctx);
	}

	if (!Base->RequestAddress(ctx, &AddressWritable) || !AddressWritable)
	{
		ScriptPosition.Message(MSG_ERROR, "Expression must be a modifiable value");
		delete this;
		return nullptr;
	}

	// Special case: Assignment to a bitfield.
	IsBitWrite = Base->GetBitValue();
	return this;
}